

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::OperatorFloatDivideFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  pointer function;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa0c;
  FunctionNullHandling in_stack_fffffffffffffa18;
  bind_lambda_function_t in_stack_fffffffffffffa20;
  LogicalType local_5d8 [2];
  scalar_function_t local_5a8;
  LogicalType local_588;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_570;
  LogicalType local_558;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_540;
  LogicalType local_528;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_510;
  _Any_data local_4f8;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  _Any_data local_4d8;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  LogicalType local_4b0;
  LogicalType local_498;
  LogicalType local_480;
  string local_468;
  ScalarFunction local_448;
  ScalarFunction local_320;
  ScalarFunction local_1f8;
  BaseScalarFunction local_d0;
  
  ::std::__cxx11::string::string((string *)&local_468,"/",(allocator *)local_5d8);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_468);
  ::std::__cxx11::string::~string((string *)&local_468);
  LogicalType::LogicalType(local_5d8,FLOAT);
  LogicalType::LogicalType(local_5d8 + 1,FLOAT);
  __l._M_len = 2;
  __l._M_array = local_5d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_510,__l,(allocator_type *)&stack0xfffffffffffffa27);
  LogicalType::LogicalType(&local_528,FLOAT);
  local_4c8 = 0;
  uStack_4c0 = 0;
  local_4d8._M_unused._M_object = (void *)0x0;
  local_4d8._8_8_ = 0;
  LogicalType::LogicalType(&local_480,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_480;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffa04;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffa0c;
  ScalarFunction::ScalarFunction
            (&local_1f8,(vector<duckdb::LogicalType,_true> *)&local_510,&local_528,
             (scalar_function_t *)&local_4d8,BindBinaryFloatingPoint<duckdb::DivideOperator>,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffa18,in_stack_fffffffffffffa20);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1f8);
  ScalarFunction::~ScalarFunction(&local_1f8);
  LogicalType::~LogicalType(&local_480);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_4d8);
  LogicalType::~LogicalType(&local_528);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_510);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_5d8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_5d8,DOUBLE);
  LogicalType::LogicalType(local_5d8 + 1,DOUBLE);
  __l_00._M_len = 2;
  __l_00._M_array = local_5d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_540,__l_00,(allocator_type *)&stack0xfffffffffffffa27);
  LogicalType::LogicalType(&local_558,DOUBLE);
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_4f8._M_unused._M_object = (void *)0x0;
  local_4f8._8_8_ = 0;
  LogicalType::LogicalType(&local_498,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_498;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffa04;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffa0c;
  ScalarFunction::ScalarFunction
            (&local_320,(vector<duckdb::LogicalType,_true> *)&local_540,&local_558,
             (scalar_function_t *)&local_4f8,BindBinaryFloatingPoint<duckdb::DivideOperator>,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffffa18,in_stack_fffffffffffffa20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_320);
  ScalarFunction::~ScalarFunction(&local_320);
  LogicalType::~LogicalType(&local_498);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_4f8);
  LogicalType::~LogicalType(&local_558);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_540);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_5d8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_5d8,INTERVAL);
  LogicalType::LogicalType(local_5d8 + 1,DOUBLE);
  __l_01._M_len = 2;
  __l_01._M_array = local_5d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_570,__l_01,(allocator_type *)&stack0xfffffffffffffa27);
  LogicalType::LogicalType(&local_588,INTERVAL);
  local_5a8.super__Function_base._M_functor._8_8_ = 0;
  local_5a8.super__Function_base._M_functor._M_unused._M_object =
       BinaryScalarFunctionIgnoreZero<duckdb::interval_t,double,duckdb::interval_t,duckdb::DivideOperator,duckdb::BinaryZeroIsNullWrapper>
  ;
  local_5a8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_5a8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_4b0,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_4b0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffa04;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffa0c;
  ScalarFunction::ScalarFunction
            (&local_448,(vector<duckdb::LogicalType,_true> *)&local_570,&local_588,&local_5a8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_01,CONSISTENT,
             in_stack_fffffffffffffa18,in_stack_fffffffffffffa20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_448);
  ScalarFunction::~ScalarFunction(&local_448);
  LogicalType::~LogicalType(&local_4b0);
  ::std::_Function_base::~_Function_base(&local_5a8.super__Function_base);
  LogicalType::~LogicalType(&local_588);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_570);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_5d8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_d0,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_d0);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorFloatDivideFun::GetFunctions() {
	ScalarFunctionSet fp_divide("/");
	fp_divide.AddFunction(ScalarFunction({LogicalType::FLOAT, LogicalType::FLOAT}, LogicalType::FLOAT, nullptr,
	                                     BindBinaryFloatingPoint<DivideOperator>));
	fp_divide.AddFunction(ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE}, LogicalType::DOUBLE, nullptr,
	                                     BindBinaryFloatingPoint<DivideOperator>));
	fp_divide.AddFunction(
	    ScalarFunction({LogicalType::INTERVAL, LogicalType::DOUBLE}, LogicalType::INTERVAL,
	                   BinaryScalarFunctionIgnoreZero<interval_t, double, interval_t, DivideOperator>));
	for (auto &func : fp_divide.functions) {
		ScalarFunction::SetReturnsError(func);
	}
	return fp_divide;
}